

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O0

string_t duckdb::StringFromTimestamp<true>(timestamp_t input,Vector *vector)

{
  bool bVar1;
  idx_t iVar2;
  string_t *this;
  unsigned_long uVar3;
  Vector *vector_00;
  char *pcVar4;
  char *micro_buffer_00;
  dtime_t *in_RDI;
  char *data;
  idx_t length;
  idx_t nano_length;
  idx_t time_length;
  idx_t date_length;
  char nano_buffer [6];
  char micro_buffer [6];
  bool add_bc;
  idx_t year_length;
  int32_t time [4];
  int32_t date [3];
  timestamp_ns_t ns;
  int32_t picos;
  dtime_t time_entry;
  date_t date_entry;
  string_t result;
  idx_t *in_stack_ffffffffffffff38;
  int32_t *in_stack_ffffffffffffff40;
  int32_t *in_stack_ffffffffffffff48;
  int32_t *date_00;
  long lVar5;
  int32_t *in_stack_ffffffffffffff50;
  int32_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  date_t in_stack_ffffffffffffff64;
  undefined1 auStack_97 [31];
  int32_t iStack_78;
  int32_t iStack_74;
  int32_t iStack_70;
  int32_t aiStack_6c [5];
  uint in_stack_ffffffffffffffb8;
  int iVar6;
  dtime_t in_stack_ffffffffffffffc0;
  timestamp_t tStack_30;
  timestamp_t atStack_28 [2];
  timestamp_t tStack_18;
  anon_union_16_2_67f50693_for_value aStack_10;
  
  tStack_18.value = (int64_t)in_RDI;
  atStack_28[0] = timestamp_t::infinity();
  bVar1 = timestamp_t::operator==(&tStack_18,atStack_28);
  if (bVar1) {
    aStack_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddString
                   ((Vector *)CONCAT44(in_stack_ffffffffffffff64.days,in_stack_ffffffffffffff60),
                    (char *)in_stack_ffffffffffffff58);
  }
  else {
    tStack_30 = timestamp_t::ninfinity();
    bVar1 = timestamp_t::operator==(&tStack_18,&tStack_30);
    if (bVar1) {
      aStack_10.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddString
                     ((Vector *)CONCAT44(in_stack_ffffffffffffff64.days,in_stack_ffffffffffffff60),
                      (char *)in_stack_ffffffffffffff58);
    }
    else {
      iVar6 = 0;
      Timestamp::Convert((timestamp_ns_t)in_stack_ffffffffffffffc0.micros,
                         (date_t *)(ulong)in_stack_ffffffffffffffb8,(dtime_t *)tStack_18.value,
                         (int32_t *)tStack_18.value);
      iVar6 = iVar6 * 1000;
      Date::Convert(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48);
      Time::Convert(in_stack_ffffffffffffffc0,&iStack_78,&iStack_74,&iStack_70,aiStack_6c);
      memset(auStack_97,0,6);
      memset(&stack0xffffffffffffff63,0,6);
      iVar2 = DateToStringCast::Length
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool *)0x2b1f4cd);
      this = (string_t *)
             TimeToStringCast::Length(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      date_00 = (int32_t *)0x0;
      if (iVar6 != 0) {
        this = (string_t *)0xf;
        lVar5 = 6;
        TimeToStringCast::FormatMicros(0,(char *)0x6);
        uVar3 = NumericCast<unsigned_long,_int,_void>(0);
        date_00 = (int32_t *)(lVar5 - uVar3);
      }
      vector_00 = (Vector *)((char *)((long)&this->value + iVar2 + 1) + (long)date_00);
      aStack_10.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString(vector_00,(idx_t)in_stack_ffffffffffffff38);
      pcVar4 = string_t::GetDataWriteable((string_t *)vector_00);
      DateToStringCast::Format((char *)this,date_00,(idx_t)vector_00,SUB81((ulong)pcVar4 >> 0x38,0))
      ;
      micro_buffer_00 = pcVar4 + iVar2 + 1;
      pcVar4[iVar2] = ' ';
      TimeToStringCast::Format((char *)this,(idx_t)date_00,(int32_t *)vector_00,micro_buffer_00);
      memcpy(micro_buffer_00 + (long)&this->value,&stack0xffffffffffffff63,(size_t)date_00);
      string_t::Finalize(this);
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aStack_10.pointer;
}

Assistant:

duckdb::string_t StringFromTimestamp(timestamp_t input, Vector &vector) {
	if (input == timestamp_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	}
	if (input == timestamp_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}

	date_t date_entry;
	dtime_t time_entry;
	int32_t picos = 0;
	if (HAS_NANOS) {
		timestamp_ns_t ns;
		ns.value = input.value;
		Timestamp::Convert(ns, date_entry, time_entry, picos);
		// Use picoseconds so we have 6 digits
		picos *= 1000;
	} else {
		Timestamp::Convert(input, date_entry, time_entry);
	}

	int32_t date[3], time[4];
	Date::Convert(date_entry, date[0], date[1], date[2]);
	Time::Convert(time_entry, time[0], time[1], time[2], time[3]);

	// format for timestamp is DATE TIME (separated by space)
	idx_t year_length;
	bool add_bc;
	char micro_buffer[6] = {};
	char nano_buffer[6] = {};
	idx_t date_length = DateToStringCast::Length(date, year_length, add_bc);
	idx_t time_length = TimeToStringCast::Length(time, micro_buffer);
	idx_t nano_length = 0;
	if (picos) {
		//	If there are ps, we need all the µs
		time_length = 15;
		nano_length = 6;
		nano_length -= NumericCast<idx_t>(TimeToStringCast::FormatMicros(picos, nano_buffer));
	}
	const idx_t length = date_length + 1 + time_length + nano_length;

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	DateToStringCast::Format(data, date, year_length, add_bc);
	data += date_length;
	*data++ = ' ';
	TimeToStringCast::Format(data, time_length, time, micro_buffer);
	data += time_length;
	memcpy(data, nano_buffer, nano_length);
	D_ASSERT(data + nano_length <= result.GetDataWriteable() + length);

	result.Finalize();
	return result;
}